

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

void __thiscall argparse::Argument::validate(Argument *this)

{
  bool bVar1;
  size_type value;
  Argument *this_local;
  
  if (((byte)this->field_0x140 >> 1 & 1) == 0) {
    value = std::vector<std::any,_std::allocator<std::any>_>::size(&this->m_values);
    bVar1 = NArgsRange::contains(&this->m_num_args_range,value);
    if ((!bVar1) && (bVar1 = std::any::has_value(&this->m_default_value), !bVar1)) {
      throw_nargs_range_validation_error(this);
    }
  }
  else {
    if (((((byte)this->field_0x140 >> 4 & 1) == 0) &&
        (bVar1 = std::any::has_value(&this->m_default_value), !bVar1)) &&
       (((byte)this->field_0x140 >> 2 & 1) != 0)) {
      throw_required_arg_not_used_error(this);
    }
    if (((((byte)this->field_0x140 >> 4 & 1) != 0) && (((byte)this->field_0x140 >> 2 & 1) != 0)) &&
       (bVar1 = std::vector<std::any,_std::allocator<std::any>_>::empty(&this->m_values), bVar1)) {
      throw_required_arg_no_value_provided_error(this);
    }
  }
  bVar1 = std::
          optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::has_value(&this->m_choices);
  if (bVar1) {
    find_default_value_in_choices_or_throw(this);
  }
  return;
}

Assistant:

void validate() const {
    if (m_is_optional) {
      // TODO: check if an implicit value was programmed for this argument
      if (!m_is_used && !m_default_value.has_value() && m_is_required) {
        throw_required_arg_not_used_error();
      }
      if (m_is_used && m_is_required && m_values.empty()) {
        throw_required_arg_no_value_provided_error();
      }
    } else {
      if (!m_num_args_range.contains(m_values.size()) &&
          !m_default_value.has_value()) {
        throw_nargs_range_validation_error();
      }
    }

    if (m_choices.has_value()) {
      // Make sure the default value (if provided)
      // is in the list of choices
      find_default_value_in_choices_or_throw();
    }
  }